

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::operator==(iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *this,iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *other)

{
  value_t vVar1;
  invalid_iterator *__return_storage_ptr__;
  allocator<char> local_41;
  string local_40;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_20;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *other_local;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_local;
  
  local_20 = other;
  other_local = this;
  if (this->m_object != other->m_object) {
    __return_storage_ptr__ = (invalid_iterator *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"cannot compare iterators of different containers",&local_41);
    invalid_iterator::create(__return_storage_ptr__,0xd4,&local_40);
    __cxa_throw(__return_storage_ptr__,&invalid_iterator::typeinfo,
                invalid_iterator::~invalid_iterator);
  }
  if (this->m_object != (pointer)0x0) {
    vVar1 = this->m_object->m_type;
    if (vVar1 == object) {
      this_local._7_1_ =
           std::operator==(&(this->m_it).object_iterator,&(other->m_it).object_iterator);
    }
    else if (vVar1 == array) {
      this_local._7_1_ =
           __gnu_cxx::operator==(&(this->m_it).array_iterator,&(other->m_it).array_iterator);
    }
    else {
      this_local._7_1_ =
           detail::operator==((primitive_iterator_t)(this->m_it).primitive_iterator.m_it,
                              (primitive_iterator_t)(other->m_it).primitive_iterator.m_it);
    }
    return this_local._7_1_;
  }
  __assert_fail("m_object != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                ,0x2ba3,
                "bool nlohmann::detail::iter_impl<nlohmann::basic_json<>>::operator==(const iter_impl<BasicJsonType> &) const [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

bool operator==(const iter_impl& other) const
            {
                // if objects are not the same, the comparison is undefined
                if (JSON_HEDLEY_UNLIKELY(m_object != other.m_object))
                {
                    JSON_THROW(invalid_iterator::create(212, "cannot compare iterators of different containers"));
                }

                JSON_ASSERT(m_object != nullptr);

                switch (m_object->m_type)
                {
                case value_t::object:
                    return (m_it.object_iterator == other.m_it.object_iterator);

                case value_t::array:
                    return (m_it.array_iterator == other.m_it.array_iterator);

                default:
                    return (m_it.primitive_iterator == other.m_it.primitive_iterator);
                }
            }